

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfloat16.h
# Opt level: O0

bool qFuzzyCompare(qfloat16 p1,qfloat16 p2)

{
  float *pfVar1;
  long in_FS_OFFSET;
  float fVar2;
  NearestFloat f2;
  NearestFloat f1;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  float local_20;
  float local_1c;
  float local_18;
  float local_14;
  float local_10 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10[0] = qfloat16::operator_cast_to_float
                          ((qfloat16 *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0)
                          );
  local_14 = qfloat16::operator_cast_to_float
                       ((qfloat16 *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
  local_18 = local_10[0] - local_14;
  fVar2 = qAbs<float>(&local_18);
  local_1c = qAbs<float>(local_10);
  local_20 = qAbs<float>(&local_14);
  pfVar1 = qMin<float>(&local_1c,&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return fVar2 * 102.5 <= *pfVar1;
  }
  __stack_chk_fail();
}

Assistant:

[[nodiscard]] inline bool qFuzzyCompare(qfloat16 p1, qfloat16 p2) noexcept
{
    qfloat16::NearestFloat f1 = static_cast<qfloat16::NearestFloat>(p1);
    qfloat16::NearestFloat f2 = static_cast<qfloat16::NearestFloat>(p2);
    // The significand precision for IEEE754 half precision is
    // 11 bits (10 explicitly stored), or approximately 3 decimal
    // digits.  In selecting the fuzzy comparison factor of 102.5f
    // (that is, (2^10+1)/10) below, we effectively select a
    // window of about 1 (least significant) decimal digit about
    // which the two operands can vary and still return true.
    return (qAbs(f1 - f2) * 102.5f <= qMin(qAbs(f1), qAbs(f2)));
}